

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  int iVar5;
  ImU32 IVar6;
  GetterYs<int> *pGVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  bool bVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pGVar7 = this->Getter;
  iVar4 = pGVar7->Count;
  iVar5 = this->Transformer->YAxis;
  IVar11.x = (float)((((double)(prim + 1) * pGVar7->XScale + pGVar7->X0) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                    (double)GImPlot->PixelRange[iVar5].Min.x);
  fVar12 = (float)(((double)*(int *)((long)pGVar7->Ys +
                                    (long)(((prim + 1 + pGVar7->Offset) % iVar4 + iVar4) % iVar4) *
                                    (long)pGVar7->Stride) -
                   GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) * GImPlot->My[iVar5] +
                  (double)GImPlot->PixelRange[iVar5].Min.y);
  fVar2 = (this->P1).x;
  fVar13 = (this->P1).y;
  fVar14 = fVar13;
  if (fVar12 <= fVar13) {
    fVar14 = fVar12;
  }
  bVar10 = false;
  if ((fVar14 < (cull_rect->Max).y) &&
     (fVar13 = (float)(-(uint)(fVar12 <= fVar13) & (uint)fVar13 |
                      ~-(uint)(fVar12 <= fVar13) & (uint)fVar12), pfVar1 = &(cull_rect->Min).y,
     bVar10 = false, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
    fVar13 = fVar2;
    if (IVar11.x <= fVar2) {
      fVar13 = IVar11.x;
    }
    if (fVar13 < (cull_rect->Max).x) {
      fVar13 = (float)(~-(uint)(IVar11.x <= fVar2) & (uint)IVar11.x |
                      -(uint)(IVar11.x <= fVar2) & (uint)fVar2);
      bVar10 = (cull_rect->Min).x <= fVar13 && fVar13 != (cull_rect->Min).x;
    }
  }
  if (bVar10 != false) {
    fVar13 = (this->P1).y;
    fVar14 = fVar13 + this->HalfWeight;
    fVar13 = fVar13 - this->HalfWeight;
    IVar6 = this->Col;
    IVar3 = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    (pIVar8->pos).x = fVar2;
    (pIVar8->pos).y = fVar14;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar6;
    pIVar8[1].pos.x = IVar11.x;
    pIVar8[1].pos.y = fVar13;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar6;
    pIVar8[2].pos.x = fVar2;
    pIVar8[2].pos.y = fVar13;
    pIVar8[2].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar6;
    pIVar8[3].pos.x = IVar11.x;
    pIVar8[3].pos.y = fVar14;
    pIVar8[3].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = DrawList->_VtxCurrentIdx;
    puVar9[1] = DrawList->_VtxCurrentIdx + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    puVar9[3] = DrawList->_VtxCurrentIdx;
    puVar9[4] = DrawList->_VtxCurrentIdx + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar14 = IVar11.x - this->HalfWeight;
    fVar13 = this->HalfWeight + IVar11.x;
    fVar2 = (this->P1).y;
    IVar6 = this->Col;
    IVar3 = *uv;
    pIVar8[4].pos.x = fVar14;
    pIVar8[4].pos.y = fVar12;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar6;
    pIVar8[1].pos.x = fVar13;
    pIVar8[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar6;
    pIVar8[2].pos.x = fVar14;
    pIVar8[2].pos.y = fVar2;
    pIVar8[2].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar6;
    pIVar8[3].pos.x = fVar13;
    pIVar8[3].pos.y = fVar12;
    pIVar8[3].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = DrawList->_VtxCurrentIdx;
    puVar9[1] = DrawList->_VtxCurrentIdx + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    puVar9[3] = DrawList->_VtxCurrentIdx;
    puVar9[4] = DrawList->_VtxCurrentIdx + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar11.y = fVar12;
  this->P1 = IVar11;
  return bVar10;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }